

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTxInReference::AbstractTxInReference
          (AbstractTxInReference *this,AbstractTxIn *tx_in)

{
  uint32_t uVar1;
  AbstractTxIn *tx_in_local;
  AbstractTxInReference *this_local;
  
  this->_vptr_AbstractTxInReference = (_func_int **)&PTR__AbstractTxInReference_00883d00;
  AbstractTxIn::GetTxid(&this->txid_,tx_in);
  uVar1 = AbstractTxIn::GetVout(tx_in);
  this->vout_ = uVar1;
  AbstractTxIn::GetUnlockingScript(&this->unlocking_script_,tx_in);
  uVar1 = AbstractTxIn::GetSequence(tx_in);
  this->sequence_ = uVar1;
  AbstractTxIn::GetScriptWitness(&this->script_witness_,tx_in);
  return;
}

Assistant:

AbstractTxInReference::AbstractTxInReference(const AbstractTxIn &tx_in)
    : txid_(tx_in.GetTxid()),
      vout_(tx_in.GetVout()),
      unlocking_script_(tx_in.GetUnlockingScript()),
      sequence_(tx_in.GetSequence()),
      script_witness_(tx_in.GetScriptWitness()) {
  // do nothing
}